

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.hpp
# Opt level: O3

void __thiscall ot::commissioner::JobManager::~JobManager(JobManager *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar1;
  pointer ppJVar2;
  
  this_00 = (this->mDefaultCommissioner).
            super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pcVar1 = (this->mImportFile)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mImportFile).field_2) {
    operator_delete(pcVar1);
  }
  Config::~Config(&this->mDefaultConf);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
  ::~_Rb_tree(&(this->mCommissionerPool)._M_t);
  ppJVar2 = (this->mJobPool).
            super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppJVar2 != (pointer)0x0) {
    operator_delete(ppJVar2);
    return;
  }
  return;
}

Assistant:

~JobManager() = default;